

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

cio_error write_some_all(cio_io_stream *io_stream,cio_write_buffer *buf,
                        cio_io_stream_write_handler_t handler,void *handler_context)

{
  size_t sVar1;
  ulong local_40;
  size_t i;
  size_t total_length;
  cio_write_buffer *wb;
  void *handler_context_local;
  cio_io_stream_write_handler_t handler_local;
  cio_write_buffer *buf_local;
  cio_io_stream *io_stream_local;
  
  total_length = (size_t)buf->next;
  i = 0;
  local_40 = 0;
  while( true ) {
    sVar1 = cio_write_buffer_get_num_buffer_elements(buf);
    if (sVar1 <= local_40) break;
    if (*(long *)(total_length + 0x18) != 0) {
      memcpy(write_check_buffer + write_check_buffer_pos,*(void **)(total_length + 0x10),
             *(size_t *)(total_length + 0x18));
    }
    write_check_buffer_pos = *(long *)(total_length + 0x18) + write_check_buffer_pos;
    i = *(long *)(total_length + 0x18) + i;
    total_length = *(size_t *)total_length;
    local_40 = local_40 + 1;
  }
  (*handler)(io_stream,handler_context,buf,CIO_SUCCESS,i);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_all(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	struct cio_write_buffer *wb = buf->next;
	size_t total_length = 0;

	for (size_t i = 0; i < cio_write_buffer_get_num_buffer_elements(buf); i++) {
		if (wb->data.element.length > 0) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length);
		}

		write_check_buffer_pos += wb->data.element.length;
		total_length += wb->data.element.length;
		wb = wb->next;
	}

	handler(io_stream, handler_context, buf, CIO_SUCCESS, total_length);

	return CIO_SUCCESS;
}